

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_multiple_bindings_initializer_list.cpp
# Opt level: O0

int main(void)

{
  undefined1 *puVar1;
  initializer_list<int> il_00;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int[],_int[],_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this;
  size_type sVar2;
  reference pvVar3;
  size_type in_RCX;
  dependency dVar4;
  dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  args;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> v;
  v1_3_0 *local_58;
  iterator local_50;
  undefined1 local_48 [8];
  i injector;
  initializer_list<int> il;
  
  injector.super_injector_t._20_4_ = 1;
  puVar1 = &injector.super_injector_t.field_0x14;
  this = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_int[],_int[],_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_int[],_int[],_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                       *)&boost::ext::di::v1_3_0::bind<int[]>);
  il_00._M_len = 3;
  il_00._M_array = (iterator)puVar1;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)puVar1;
  dVar4 = boost::ext::di::v1_3_0::core::
          dependency<boost::ext::di::v1_3_0::scopes::deduce,_int[],_int[],_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
          ::to<int,_0>(this,il_00);
  local_58 = dVar4.
             super_scope<boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_int>.
             object_._M_array;
  local_50 = dVar4.
             super_scope<boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_int>.
             object_._M_len;
  args.super_scope<boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_int>.
  object_._M_len = in_RCX;
  args.super_scope<boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_int>.
  object_._M_array = local_50;
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            ((i *)local_48,local_58,args);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<std::vector<int,_std::allocator<int>_>,_0>
            ((vector<int,_std::allocator<int>_> *)local_80,
             (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)local_48);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_80);
  if (sVar2 != 3) {
    __assert_fail("3 == v.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                  ,0x28,"int main()");
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_80,0);
  if (*pvVar3 != 1) {
    __assert_fail("1 == v[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                  ,0x29,"int main()");
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_80,1);
  if (*pvVar3 != 2) {
    __assert_fail("2 == v[1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                  ,0x2a,"int main()");
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_80,2);
  if (*pvVar3 == 3) {
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
    return 0;
  }
  __assert_fail("3 == v[2]",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                ,0x2b,"int main()");
}

Assistant:

int main() {
  // clang-format off
  auto il = {1, 2, 3};
  auto injector = di::make_injector(
    di::bind<int[]>().to(il) // or di::bind<int*[]>.to(il)
  );
  // clang-format on

  auto v = injector.create<std::vector<int>>();
  assert(3 == v.size());
  assert(1 == v[0]);
  assert(2 == v[1]);
  assert(3 == v[2]);
}